

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_REP(Context *ctx)

{
  uint uVar1;
  size_t in_R8;
  char src0 [64];
  
  make_METAL_srcarg_string(ctx,0,1,src0,in_R8);
  uVar1 = ctx->reps;
  output_line(ctx,"for (int rep%u = 0; rep%u < %s; rep%u++) {",(ulong)uVar1,(ulong)uVar1,src0,
              (ulong)uVar1);
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_REP(Context *ctx)
{
    // !!! FIXME:
    // msdn docs say legal loop values are 0 to 255. We can check DEFI values
    //  at parse time, but if they are pulling a value from a uniform, do
    //  we clamp here?
    // !!! FIXME: swizzle is legal here, right?
    char src0[64]; make_METAL_srcarg_string_x(ctx, 0, src0, sizeof (src0));
    const uint rep = (uint) ctx->reps;
    output_line(ctx, "for (int rep%u = 0; rep%u < %s; rep%u++) {",
                rep, rep, src0, rep);
    ctx->indent++;
}